

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariterators.h
# Opt level: O0

utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::operator=(utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *this,uint32_t x)

{
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pbVar1;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  byte local_31;
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  byte local_22;
  byte local_21;
  int local_20;
  uint32_t uStack_1c;
  uint8_t b;
  int n;
  uint32_t x_local;
  utf8insert_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  if (x < 0x80) {
    local_20 = 0;
    local_21 = (byte)x;
  }
  else if (x < 0x800) {
    local_20 = 1;
    local_21 = (byte)(x >> 6) | 0xc0;
  }
  else if (x < 0x10000) {
    if ((0xd7ff < x) && (x < 0xe000)) {
      return this;
    }
    local_21 = (byte)(x >> 0xc) | 0xe0;
    local_20 = 2;
  }
  else {
    if (0x10ffff < x) {
      return this;
    }
    local_21 = (byte)(x >> 0x12) | 0xf0;
    local_20 = 3;
  }
  local_22 = local_21;
  uStack_1c = x;
  _n = this;
  local_30 = std::
             back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator++(&this->_p,0);
  pbVar1 = std::
           back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&local_30);
  std::
  back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::operator=(pbVar1,(value_type *)&local_22);
  while (local_20 != 0) {
    local_31 = (byte)(uStack_1c >> ((char)(local_20 + -1) * '\x06' & 0x1fU)) & 0x3f | 0x80;
    local_21 = local_31;
    local_20 = local_20 + -1;
    local_40 = std::
               back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator++(&this->_p,0);
    pbVar1 = std::
             back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_40);
    std::
    back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator=(pbVar1,(value_type *)&local_31);
  }
  return this;
}

Assistant:

utf8insert_iterator& operator=(uint32_t x)
    {
        int n;
        uint8_t b;
        if (x<0x80) {
            n=0;
            b=x;
        }
        else if (x<0x800) {
            n=1;
            b=0xc0|(x>>6);
        }
        else if (x<0x10000) {
            if (x>=0xd800 && x<0xe000)
                return *this;
            b=0xe0|(x>>12);
            n=2;
        }
        else if (x<0x110000) {
            b=0xf0|(x>>18);
            n=3;
        }
        else {
            // ignoring invalid value
            return *this;
        }
        *_p++ = b;
        while (n--) {
            b= 0x80 | ((x>>(6*n))&0x3f);
            *_p++ = b;
        }
        return *this;
    }